

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

Reader __thiscall capnp::_::ListReader::asText(ListReader *this)

{
  byte *pbVar1;
  int line;
  char *condition;
  Reader RVar2;
  ulong uStackY_20;
  Fault f;
  
  if ((this->structDataSize == 8) && (this->structPointerCount == 0)) {
    uStackY_20 = (ulong)this->elementCount;
    if (uStackY_20 == 0) {
      condition = "size > 0";
      line = 0xc07;
    }
    else {
      pbVar1 = this->ptr;
      if (pbVar1[uStackY_20 - 1] == '\0') goto LAB_0015ef3b;
      condition = "cptr[size] == \'\\0\'";
      line = 0xc0e;
    }
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[50]>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
               ,line,FAILED,condition,"\"Message contains text that is not NUL-terminated.\"",
               (char (*) [50])"Message contains text that is not NUL-terminated.");
  }
  else {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[38]>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
               ,0xc01,FAILED,
               "structDataSize == G(8) * BITS && structPointerCount == ZERO * POINTERS",
               "\"Expected Text, got list of non-bytes.\"",
               (char (*) [38])"Expected Text, got list of non-bytes.");
  }
  kj::_::Debug::Fault::~Fault(&f);
  uStackY_20 = 1;
  pbVar1 = "";
LAB_0015ef3b:
  RVar2.super_StringPtr.content.size_ = uStackY_20;
  RVar2.super_StringPtr.content.ptr = (char *)pbVar1;
  return (Reader)RVar2.super_StringPtr.content;
}

Assistant:

Text::Reader ListReader::asText() {
  KJ_REQUIRE(structDataSize == G(8) * BITS && structPointerCount == ZERO * POINTERS,
             "Expected Text, got list of non-bytes.") {
    return Text::Reader();
  }

  size_t size = unbound(elementCount / ELEMENTS);

  KJ_REQUIRE(size > 0, "Message contains text that is not NUL-terminated.") {
    return Text::Reader();
  }

  const char* cptr = reinterpret_cast<const char*>(ptr);
  --size;  // NUL terminator

  KJ_REQUIRE(cptr[size] == '\0', "Message contains text that is not NUL-terminated.") {
    return Text::Reader();
  }

  return Text::Reader(cptr, size);
}